

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.hh
# Opt level: O0

void __thiscall
QUtil::QPDFTime::QPDFTime
          (QPDFTime *this,int year,int month,int day,int hour,int minute,int second,int tz_delta)

{
  int minute_local;
  int hour_local;
  int day_local;
  int month_local;
  int year_local;
  QPDFTime *this_local;
  
  this->year = year;
  this->month = month;
  this->day = day;
  this->hour = hour;
  this->minute = minute;
  this->second = second;
  this->tz_delta = tz_delta;
  return;
}

Assistant:

QPDFTime(int year, int month, int day, int hour, int minute, int second, int tz_delta) :
            year(year),
            month(month),
            day(day),
            hour(hour),
            minute(minute),
            second(second),
            tz_delta(tz_delta)
        {
        }